

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::EnumDescriptorProto::SharedDtor(EnumDescriptorProto *this)

{
  internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  if ((this != (EnumDescriptorProto *)&_EnumDescriptorProto_default_instance_) &&
     (this->options_ != (EnumOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    return;
  }
  return;
}

Assistant:

void EnumDescriptorProto::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete options_;
  }
}